

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O1

void trial::protocol::bintoken::
     format<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,std::allocator<char>>
               (basic_variable<std::allocator<char>_> *data,
               basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
               *result)

{
  basic_formatter<std::allocator<char>_> vis;
  writer writer;
  basic_formatter<std::allocator<char>_> local_80;
  type local_78;
  type local_68 [5];
  
  basic_writer<16ul>::
  basic_writer<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            ((basic_writer<16ul> *)&local_78.__align,result);
  local_80.writer = (writer *)&local_78;
  dynamic::
  visit<trial::protocol::bintoken::detail::basic_formatter<std::allocator<char>>&,std::allocator<char>>
            (&local_80,data);
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&local_68[0].__align);
  (**(code **)local_78._0_8_)(&local_78);
  return;
}

Assistant:

void format(const trial::dynamic::basic_variable<Allocator>& data,
            T& result)
{
    bintoken::writer writer(result);
    partial::format(data, writer);
}